

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O0

htmlparser_ctx * ctemplate_htmlparser::htmlparser_new(void)

{
  statemachine_definition *psVar1;
  statemachine_ctx *psVar2;
  jsparser_ctx *pjVar3;
  entityfilter_ctx *peVar4;
  htmlparser_ctx *html;
  
  html = (htmlparser_ctx *)calloc(1,0x328);
  if (html == (htmlparser_ctx *)0x0) {
    html = (htmlparser_ctx *)0x0;
  }
  else {
    psVar1 = create_statemachine_definition();
    html->statemachine_def = psVar1;
    if (html->statemachine_def == (statemachine_definition *)0x0) {
      html = (htmlparser_ctx *)0x0;
    }
    else {
      psVar2 = statemachine_new(html->statemachine_def,html);
      html->statemachine = psVar2;
      if (html->statemachine == (statemachine_ctx *)0x0) {
        html = (htmlparser_ctx *)0x0;
      }
      else {
        pjVar3 = jsparser_new();
        html->jsparser = pjVar3;
        if (html->jsparser == (jsparser_ctx *)0x0) {
          html = (htmlparser_ctx *)0x0;
        }
        else {
          peVar4 = entityfilter_new();
          html->entityfilter = peVar4;
          if (html->entityfilter == (entityfilter_ctx *)0x0) {
            html = (htmlparser_ctx *)0x0;
          }
          else {
            htmlparser_reset(html);
          }
        }
      }
    }
  }
  return html;
}

Assistant:

htmlparser_ctx *htmlparser_new()
{
  htmlparser_ctx *html;

  html = CAST(htmlparser_ctx *, calloc(1, sizeof(htmlparser_ctx)));
  if (html == NULL)
    return NULL;

  html->statemachine_def = create_statemachine_definition();
  if (html->statemachine_def == NULL)
    return NULL;

  html->statemachine = statemachine_new(html->statemachine_def, html);
  if (html->statemachine == NULL)
    return NULL;

  html->jsparser = jsparser_new();
  if (html->jsparser == NULL)
    return NULL;

  html->entityfilter = entityfilter_new();
  if (html->entityfilter == NULL)
    return NULL;

  htmlparser_reset(html);

  return html;
}